

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O0

bool CoreML::checkSingleWeightType(WeightParams *param)

{
  char cVar1;
  int iVar2;
  long lVar3;
  int numFilledIn;
  WeightParams *param_local;
  
  iVar2 = Specification::WeightParams::floatvalue_size(param);
  cVar1 = 0 < iVar2;
  Specification::WeightParams::float16value_abi_cxx11_(param);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    cVar1 = cVar1 + '\x01';
  }
  Specification::WeightParams::rawvalue_abi_cxx11_(param);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    cVar1 = cVar1 + '\x01';
  }
  Specification::WeightParams::int8rawvalue_abi_cxx11_(param);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    cVar1 = cVar1 + '\x01';
  }
  return cVar1 == '\x01';
}

Assistant:

inline bool checkSingleWeightType(const Specification::WeightParams &param) {
        int numFilledIn = 0;
        if (param.floatvalue_size() > 0)
            numFilledIn++;
        if (param.float16value().size() > 0)
            numFilledIn++;
        if (param.rawvalue().size() > 0)
            numFilledIn++;
        if (param.int8rawvalue().size() > 0)
            numFilledIn++;
        return (numFilledIn == 1);
    }